

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

uint8_t * __thiscall
edition_unittest::TestNestedMessageHasBits_NestedMessage::_InternalSerialize
          (TestNestedMessageHasBits_NestedMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  anon_union_56_1_493b367e_for_TestNestedMessageHasBits_NestedMessage_3 *this_00;
  int *piVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  Value<google::protobuf::internal::GenericTypeHandler<edition_unittest::ForeignMessage>_> *value;
  uint8_t *puVar5;
  byte *pbVar6;
  ulong uVar7;
  ulong uVar8;
  int index;
  uint uVar9;
  uint uVar10;
  
  uVar10 = *(uint *)((long)&this->field_0 + 0x10);
  if (0 < (int)uVar10) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (stream->end_ <= target) {
      _InternalSerialize();
    }
    this_00 = &this->field_0;
    *target = 10;
    pbVar6 = target + 1;
    uVar9 = uVar10;
    if (0x7f < uVar10) {
      do {
        target = pbVar6;
        *target = (byte)uVar9 | 0x80;
        uVar10 = uVar9 >> 7;
        pbVar6 = target + 1;
        bVar2 = 0x3fff < uVar9;
        uVar9 = uVar10;
      } while (bVar2);
    }
    *pbVar6 = (byte)uVar10;
    if ((undefined1  [56])((undefined1  [56])*this_00 & (undefined1  [56])0x4) ==
        (undefined1  [56])0x0) {
      piVar4 = (int *)((long)&this->field_0 + 8);
    }
    else {
      piVar4 = (int *)google::protobuf::internal::LongSooRep::elements
                                ((LongSooRep *)&this_00->_impl_);
    }
    target = target + 2;
    iVar3 = google::protobuf::internal::SooRep::size
                      ((SooRep *)&this_00->_impl_,
                       (undefined1  [56])((undefined1  [56])*this_00 & (undefined1  [56])0x4) ==
                       (undefined1  [56])0x0);
    piVar1 = piVar4 + iVar3;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar7 = (ulong)*piVar4;
      uVar8 = uVar7;
      if (0x7f < uVar7) {
        do {
          *target = (byte)uVar8 | 0x80;
          uVar7 = uVar8 >> 7;
          target = target + 1;
          bVar2 = 0x3fff < uVar8;
          uVar8 = uVar7;
        } while (bVar2);
      }
      piVar4 = piVar4 + 1;
      *target = (byte)uVar7;
      target = target + 1;
    } while (piVar4 < piVar1);
  }
  iVar3 = *(int *)((long)&this->field_0 + 0x20);
  if (iVar3 != 0) {
    index = 0;
    do {
      value = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::internal::GenericTypeHandler<edition_unittest::ForeignMessage>>
                        (&(this->field_0)._impl_.nestedmessage_repeated_foreignmessage_.
                          super_RepeatedPtrFieldBase,index);
      target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                         (2,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target,
                          stream);
      index = index + 1;
    } while (iVar3 != index);
  }
  uVar8 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar8 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar8 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar5;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestNestedMessageHasBits_NestedMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestNestedMessageHasBits_NestedMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestNestedMessageHasBits.NestedMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 nestedmessage_repeated_int32 = 1;
  {
    int byte_size = this_._impl_._nestedmessage_repeated_int32_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1, this_._internal_nestedmessage_repeated_int32(), byte_size, target);
    }
  }

  // repeated .edition_unittest.ForeignMessage nestedmessage_repeated_foreignmessage = 2;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_nestedmessage_repeated_foreignmessage_size());
       i < n; i++) {
    const auto& repfield = this_._internal_nestedmessage_repeated_foreignmessage().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            2, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestNestedMessageHasBits.NestedMessage)
  return target;
}